

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O1

_Bool mat4_decompose(mat4_t m,vec3_t *scale,quat_t *rot,vec3_t *trans)

{
  ulong uVar1;
  mat3_t m_00;
  _Bool _Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  undefined4 uVar7;
  quat_t qVar8;
  undefined4 in_stack_ffffffffffffff24;
  
  fVar3 = mat4_determinant(m);
  fVar4 = m.m[0][3] * m.m[0][3] +
          m.m[0][2] * m.m[0][2] + m.m[0][0] * m.m[0][0] + m.m[0][1] * m.m[0][1];
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
    m.m[0][3] = extraout_XMM0_Db;
    uVar7 = extraout_XMM0_Dc;
  }
  else {
    fVar4 = SQRT(fVar4);
    uVar7 = m.m[0][3];
  }
  fVar5 = m.m[1][3] * m.m[1][3] +
          m.m[1][2] * m.m[1][2] + m.m[1][0] * m.m[1][0] + m.m[1][1] * m.m[1][1];
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar6 = m.m[2][3] * m.m[2][3] +
          m.m[2][2] * m.m[2][2] + m.m[2][0] * m.m[2][0] + m.m[2][1] * m.m[2][1];
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  scale->x = fVar4;
  scale->y = fVar5;
  scale->z = fVar6;
  trans->x = (float)m._48_4_;
  trans->y = (float)m._52_4_;
  trans->z = m.m[3][2];
  if (fVar3 < 0.0) {
    uVar1._0_4_ = scale->x;
    uVar1._4_4_ = scale->y;
    scale->x = (float)(int)(uVar1 ^ 0x8000000080000000);
    scale->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
    scale->z = -scale->z;
  }
  fVar3 = scale->y;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    _Var2 = (_Bool)(-(scale->x != 0.0) & 1);
    m.m[1][1] = m.m[1][1] / fVar3;
    m.m[1][2] = m.m[1][2] / fVar3;
  }
  else {
    _Var2 = false;
  }
  fVar3 = scale->z;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    m.m[2][0] = m.m[2][0] / fVar3;
    m.m[2][1] = m.m[2][1] / fVar3;
    m.m[2][2] = m.m[2][2] / fVar3;
  }
  else {
    _Var2 = false;
  }
  m_00.m[0][1] = m.m[1][2];
  m_00.m[0][0] = m.m[1][1];
  m_00.m[0][2] = m.m[2][0];
  m_00.m[1][0] = m.m[2][1];
  m_00.m[1][1] = m.m[2][2];
  m_00.m[1][2] = (float)in_stack_ffffffffffffff24;
  m_00.m[2][0] = fVar4;
  m_00.m[2][1] = m.m[0][3];
  m_00.m[2][2] = (float)uVar7;
  qVar8 = quat_from_mat3(m_00);
  *rot = qVar8;
  return _Var2;
}

Assistant:

bool
mat4_decompose(mat4_t m, vec3_t* scale, quat_t* rot, vec3_t* trans) {
    mat3_t	rot_matrix;
    bool	ret		= true;
    vec3_t	col0	= vec3(m.col[0].x, m.col[0].y, m.col[0].z);
    vec3_t	col1	= vec3(m.col[1].x, m.col[1].y, m.col[1].z);
    vec3_t	col2	= vec3(m.col[2].x, m.col[2].y, m.col[2].z);
    float	det	= mat4_determinant(m);

    *scale	= vec3(vec4_length(m.col[0]), vec4_length(m.col[1]), vec4_length(m.col[2]));
    *trans	= vec3(m.col[3].x, m.col[3].y, m.col[3].z);

    if( det < 0 )
        *scale	= vec3_neg(*scale);

    if( scale->x != 0.0f ) {
        col0	= vec3_divf(col0, scale->x);
    } else {
        ret		= false;
    }

    if( scale->y != 0.0f ) {
        col1	= vec3_divf(col1, scale->y);
    } else {
        ret		= false;
    }

    if( scale->z != 0.0f ) {
        col2	= vec3_divf(col2, scale->z);
    } else {
        ret		= false;
    }

    rot_matrix	= mat3(col0.x, col0.y, col0.z,
                   col1.x, col1.y, col1.z,
                   col2.x, col2.y, col2.z);

    *rot	= quat_from_mat3(rot_matrix);

    return ret;
}